

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::MinerImpl::testBlockValidity
          (MinerImpl *this,CBlock *block,bool check_merkle_root,BlockValidationState *state)

{
  CBlockIndex *pindexPrev;
  uint256 *puVar1;
  CChainParams *chainparams;
  bool bVar2;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  Chainstate *pCVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  unique_lock<std::recursive_mutex> local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device = &cs_main.super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x398,"chainman","m_node.chainman");
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar3->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pindexPrev = (pCVar4->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
  puVar1 = pindexPrev->phashBlock;
  if (puVar1 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_58 = *(undefined1 (*) [16])(puVar1->super_base_blob<256U>).m_data._M_elems;
  local_48 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10))->_M_local_buf;
  auVar6[0] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x10] == local_48._M_local_buf[0]);
  auVar6[1] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x11] == local_48._M_local_buf[1]);
  auVar6[2] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x12] == local_48._M_local_buf[2]);
  auVar6[3] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x13] == local_48._M_local_buf[3]);
  auVar6[4] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x14] == local_48._M_local_buf[4]);
  auVar6[5] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x15] == local_48._M_local_buf[5]);
  auVar6[6] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x16] == local_48._M_local_buf[6]);
  auVar6[7] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x17] == local_48._M_local_buf[7]);
  auVar6[8] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x18] == local_48._M_local_buf[8]);
  auVar6[9] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                [0x19] == local_48._M_local_buf[9]);
  auVar6[10] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                 [0x1a] == local_48._M_local_buf[10]);
  auVar6[0xb] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0x1b] == local_48._M_local_buf[0xb]);
  auVar6[0xc] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0x1c] == local_48._M_local_buf[0xc]);
  auVar6[0xd] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0x1d] == local_48._M_local_buf[0xd]);
  auVar6[0xe] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0x1e] == local_48._M_local_buf[0xe]);
  auVar6[0xf] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0x1f] == local_48._M_local_buf[0xf]);
  auVar5[0] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0]
               == local_58[0]);
  auVar5[1] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1]
               == local_58[1]);
  auVar5[2] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2]
               == local_58[2]);
  auVar5[3] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3]
               == local_58[3]);
  auVar5[4] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4]
               == local_58[4]);
  auVar5[5] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5]
               == local_58[5]);
  auVar5[6] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6]
               == local_58[6]);
  auVar5[7] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7]
               == local_58[7]);
  auVar5[8] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8]
               == local_58[8]);
  auVar5[9] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9]
               == local_58[9]);
  auVar5[10] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10]
                == local_58[10]);
  auVar5[0xb] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0xb] == local_58[0xb]);
  auVar5[0xc] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0xc] == local_58[0xc]);
  auVar5[0xd] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0xd] == local_58[0xd]);
  auVar5[0xe] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0xe] == local_58[0xe]);
  auVar5[0xf] = -((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
                  [0xf] == local_58[0xf]);
  auVar5 = auVar5 & auVar6;
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
    puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&this->m_node->chainman,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                        ,0x398,"chainman","m_node.chainman");
    chainparams = (((puVar3->_M_t).
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                  chainparams;
    puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&this->m_node->chainman,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                        ,0x398,"chainman","m_node.chainman");
    pCVar4 = ChainstateManager::ActiveChainstate
                       ((puVar3->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    bVar2 = TestBlockValidity(state,chainparams,pCVar4,block,pindexPrev,false,check_merkle_root);
  }
  else {
    local_58._0_8_ = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Block does not connect to current chain tip.","");
    if ((state->super_ValidationState<BlockValidationResult>).m_mode == M_VALID) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(state->super_ValidationState<BlockValidationResult>).m_reject_reason,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    }
    (state->super_ValidationState<BlockValidationResult>).m_mode = M_ERROR;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool testBlockValidity(const CBlock& block, bool check_merkle_root, BlockValidationState& state) override
    {
        LOCK(cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        // Fail if the tip updated before the lock was taken
        if (block.hashPrevBlock != tip->GetBlockHash()) {
            state.Error("Block does not connect to current chain tip.");
            return false;
        }

        return TestBlockValidity(state, chainman().GetParams(), chainman().ActiveChainstate(), block, tip, /*fCheckPOW=*/false, check_merkle_root);
    }